

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O2

void __thiscall Assimp::Blender::DNA::AddPrimitiveStructures(DNA *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  vector<Assimp::Blender::Structure> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pSVar3;
  pointer pSVar4;
  mapped_type_conflict3 *pmVar5;
  allocator local_a9;
  Structure local_a8;
  
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&local_a8,"int",&local_a9);
  this_00 = &this->indices;
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  this_01 = &this->structures;
  *pmVar5 = ((long)pSVar3 - (long)pSVar4) / 0x78;
  ::std::__cxx11::string::~string((string *)&local_a8);
  paVar1 = &local_a8.name.field_2;
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &local_a8.indices._M_t._M_impl.super__Rb_tree_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  Structure::~Structure(&local_a8);
  ::std::__cxx11::string::assign
            ((char *)((this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 4;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&local_a8,"short",&local_a9);
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4) / 0x78;
  ::std::__cxx11::string::~string((string *)&local_a8);
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  Structure::~Structure(&local_a8);
  ::std::__cxx11::string::assign
            ((char *)((this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 2;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&local_a8,"char",&local_a9);
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4) / 0x78;
  ::std::__cxx11::string::~string((string *)&local_a8);
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  Structure::~Structure(&local_a8);
  ::std::__cxx11::string::assign
            ((char *)((this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 1;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&local_a8,"float",&local_a9);
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4) / 0x78;
  ::std::__cxx11::string::~string((string *)&local_a8);
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  Structure::~Structure(&local_a8);
  ::std::__cxx11::string::assign
            ((char *)((this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 4;
  pSVar3 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = (this->structures).
           super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
           super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ::std::__cxx11::string::string((string *)&local_a8,"double",&local_a9);
  pmVar5 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::operator[](this_00,&local_a8.name);
  *pmVar5 = ((long)pSVar3 - (long)pSVar4) / 0x78;
  ::std::__cxx11::string::~string((string *)&local_a8);
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.fields.super_vector<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>.
  super__Vector_base<Assimp::Blender::Field,_std::allocator<Assimp::Blender::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.cache_idx = 0xffffffffffffffff;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  ::std::vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>::
  emplace_back<Assimp::Blender::Structure>
            (&this_01->
              super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>,
             &local_a8);
  Structure::~Structure(&local_a8);
  ::std::__cxx11::string::assign
            ((char *)((this->structures).
                      super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      .
                      super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1));
  (this->structures).
  super_vector<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  super__Vector_base<Assimp::Blender::Structure,_std::allocator<Assimp::Blender::Structure>_>.
  _M_impl.super__Vector_impl_data._M_finish[-1].size = 8;
  return;
}

Assistant:

void DNA :: AddPrimitiveStructures()
{
    // NOTE: these are just dummies. Their presence enforces
    // Structure::Convert<target_type> to be called on these
    // empty structures. These converters are special
    // overloads which scan the name of the structure and
    // perform the required data type conversion if one
    // of these special names is found in the structure
    // in question.

    indices["int"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "int";
    structures.back().size = 4;

    indices["short"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "short";
    structures.back().size = 2;


    indices["char"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "char";
    structures.back().size = 1;


    indices["float"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "float";
    structures.back().size = 4;


    indices["double"] = structures.size();
    structures.push_back( Structure() );
    structures.back().name = "double";
    structures.back().size = 8;

    // no long, seemingly.
}